

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O1

st_h2o_http1client_private_t *
create_client(h2o_http1client_t **_client,void *data,h2o_http1client_ctx_t *ctx,
             h2o_iovec_t ssl_server_name,h2o_http1client_connect_cb cb)

{
  st_h2o_http1client_private_t *psVar1;
  h2o_iovec_t hVar2;
  
  psVar1 = (st_h2o_http1client_private_t *)malloc(0x90);
  if (psVar1 != (st_h2o_http1client_private_t *)0x0) {
    memset(&(psVar1->super).sockpool,0,0x88);
    (psVar1->super).ctx = ctx;
    if (ssl_server_name.base != (char *)0x0) {
      hVar2 = h2o_strdup((h2o_mem_pool_t *)0x0,ssl_server_name.base,ssl_server_name.len);
      (psVar1->super).ssl.server_name = hVar2.base;
    }
    (psVar1->super).data = data;
    (psVar1->_cb).on_connect = cb;
    if (_client != (h2o_http1client_t **)0x0) {
      *_client = (h2o_http1client_t *)psVar1;
    }
    return psVar1;
  }
  h2o__fatal(
            "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
            );
}

Assistant:

static struct st_h2o_http1client_private_t *create_client(h2o_http1client_t **_client, void *data, h2o_http1client_ctx_t *ctx,
                                                          h2o_iovec_t ssl_server_name, h2o_http1client_connect_cb cb)
{
    struct st_h2o_http1client_private_t *client = h2o_mem_alloc(sizeof(*client));

    *client = (struct st_h2o_http1client_private_t){{ctx}};
    if (ssl_server_name.base != NULL)
        client->super.ssl.server_name = h2o_strdup(NULL, ssl_server_name.base, ssl_server_name.len).base;
    client->super.data = data;
    client->_cb.on_connect = cb;
    /* caller needs to setup _cb, timeout.cb, sock, and sock->data */

    if (_client != NULL)
        *_client = &client->super;
    return client;
}